

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

iterator __thiscall
spvtools::opt::InlinePass::AddStoresForVariableInitializers
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr)

{
  bool bVar1;
  IRContext *this_00;
  IRContext *pIVar2;
  BasicBlock *new_blk_ptr_00;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  uint32_t val_id;
  size_type sVar5;
  mapped_type *pmVar6;
  uint uVar7;
  DefUseManager *line_inst;
  AssemblyGrammar *pAVar8;
  UptrVector *pUVar9;
  iterator *callee_itr;
  DebugScope local_58;
  DebugInlinedAtContext *local_50;
  iterator local_48;
  DebugInlinedAtContext *local_40;
  UptrVector *local_38;
  
  pUVar9 = callee_first_block_itr.container_;
  pAVar8 = (AssemblyGrammar *)&((callee_itr->super_iterator).node_)->context_;
  local_50 = inlined_at_ctx;
  local_48.node_ = (Instruction *)this;
  local_40 = (DebugInlinedAtContext *)new_blk_ptr;
  local_38 = pUVar9;
  do {
    this_00 = *(IRContext **)pAVar8;
    if (this_00->unique_id_ != OpVariable) {
      CVar3 = Instruction::GetCommonDebugOpcode((Instruction *)this_00);
      if (CVar3 != CommonDebugInfoDebugDeclare) {
        ((local_48.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)this_00;
        return (iterator)(iterator)local_48.node_;
      }
    }
    if (this_00->unique_id_ == OpVariable) {
      bVar1 = (bool)this_00->field_0x2d;
      uVar7 = (bVar1 & 1) + 1;
      if ((bool)this_00->field_0x2c == false) {
        uVar7 = (uint)bVar1;
      }
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&(this_00->consumer_).super__Function_base._M_functor + 8) -
                       *(long *)&(this_00->consumer_).super__Function_base._M_functor) >> 4) *
          -0x55555555 - uVar7 == 2) {
        uVar4 = 0;
        if ((bVar1 & 1U) != 0) {
          uVar4 = Instruction::GetSingleWordOperand
                            ((Instruction *)this_00,(uint)(byte)this_00->field_0x2c);
        }
        local_58.lexical_scope_ = uVar4;
        sVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_50,&local_58.lexical_scope_);
        if (sVar5 == 0) {
          ((Pass *)&(local_48.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)->
          _vptr_Pass = (_func_int **)this_00;
          __assert_fail("callee2caller.count(callee_itr->result_id()) && \"Expected the variable to have already been mapped.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                        ,0x142,
                        "InstructionList::iterator spvtools::opt::InlinePass::AddStoresForVariableInitializers(const std::unordered_map<uint32_t, uint32_t> &, analysis::DebugInlinedAtContext *, std::unique_ptr<BasicBlock> *, UptrVectorIterator<BasicBlock>)"
                       );
        }
        uVar4 = 0;
        if ((bool)this_00->field_0x2d == true) {
          uVar4 = Instruction::GetSingleWordOperand
                            ((Instruction *)this_00,(uint)(byte)this_00->field_0x2c);
        }
        local_58.lexical_scope_ = uVar4;
        pmVar6 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)local_50,&local_58.lexical_scope_);
        uVar4 = *pmVar6;
        uVar7 = ((byte)this_00->field_0x2d & 1) + 1;
        if ((bool)this_00->field_0x2c == false) {
          uVar7 = (uint)(byte)this_00->field_0x2d;
        }
        val_id = Instruction::GetSingleWordOperand((Instruction *)this_00,uVar7 + 1);
        line_inst = (DefUseManager *)
                    (((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       *)&(this_00->consumer_)._M_invoker)->
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        if (line_inst ==
            (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl) {
          line_inst = (DefUseManager *)0x0;
        }
        pIVar2 = (IRContext *)(callee2caller->_M_h)._M_rehash_policy._M_next_resize;
        if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
          IRContext::BuildDebugInfoManager(pIVar2);
        }
        new_blk_ptr = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_40;
        local_58 = analysis::DebugInfoManager::BuildDebugScope
                             ((pIVar2->debug_info_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                              ._M_head_impl,(DebugScope *)&this_00->feature_mgr_,local_40);
        pUVar9 = local_38;
        AddStore((InlinePass *)callee2caller,uVar4,val_id,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)local_38,(Instruction *)line_inst,&local_58);
      }
    }
    CVar3 = Instruction::GetCommonDebugOpcode((Instruction *)this_00);
    if (CVar3 == CommonDebugInfoDebugDeclare) {
      new_blk_ptr_00 =
           (BasicBlock *)
           (pUVar9->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = (IRContext *)(callee2caller->_M_h)._M_rehash_policy._M_next_resize;
      if ((pIVar2->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(pIVar2);
      }
      uVar4 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                        ((pIVar2->debug_info_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                         _M_head_impl,((DebugScope *)&this_00->feature_mgr_)->inlined_at_,
                         (DebugInlinedAtContext *)new_blk_ptr);
      InlineSingleInstruction
                ((InlinePass *)callee2caller,
                 (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)local_50,new_blk_ptr_00,(Instruction *)this_00,uVar4);
    }
    pAVar8 = &this_00->grammar_;
  } while( true );
}

Assistant:

InstructionList::iterator InlinePass::AddStoresForVariableInitializers(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block_itr) {
  auto callee_itr = callee_first_block_itr->begin();
  while (callee_itr->opcode() == spv::Op::OpVariable ||
         callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
    if (callee_itr->opcode() == spv::Op::OpVariable &&
        callee_itr->NumInOperands() == 2) {
      assert(callee2caller.count(callee_itr->result_id()) &&
             "Expected the variable to have already been mapped.");
      uint32_t new_var_id = callee2caller.at(callee_itr->result_id());

      // The initializer must be a constant or global value.  No mapped
      // should be used.
      uint32_t val_id = callee_itr->GetSingleWordInOperand(1);
      AddStore(new_var_id, val_id, new_blk_ptr, callee_itr->dbg_line_inst(),
               context()->get_debug_info_mgr()->BuildDebugScope(
                   callee_itr->GetDebugScope(), inlined_at_ctx));
    }
    if (callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
      InlineSingleInstruction(
          callee2caller, new_blk_ptr->get(), &*callee_itr,
          context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
              callee_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx));
    }
    ++callee_itr;
  }
  return callee_itr;
}